

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathCacheFreeObjectList(xmlPointerListPtr list)

{
  void *pvVar1;
  void *pvVar2;
  long lVar3;
  
  if (0 < list->number) {
    lVar3 = 0;
    do {
      pvVar1 = list->items[lVar3];
      if (*(long *)((long)pvVar1 + 8) != 0) {
        pvVar2 = *(void **)(*(long *)((long)pvVar1 + 8) + 8);
        if (pvVar2 != (void *)0x0) {
          (*xmlFree)(pvVar2);
        }
        (*xmlFree)(*(void **)((long)pvVar1 + 8));
      }
      (*xmlFree)(pvVar1);
      lVar3 = lVar3 + 1;
    } while (lVar3 < list->number);
  }
  if (list->items != (void **)0x0) {
    (*xmlFree)(list->items);
  }
  (*xmlFree)(list);
  return;
}

Assistant:

static void
xmlXPathCacheFreeObjectList(xmlPointerListPtr list)
{
    int i;
    xmlXPathObjectPtr obj;

    if (list == NULL)
	return;

    for (i = 0; i < list->number; i++) {
	obj = list->items[i];
	/*
	* Note that it is already assured that we don't need to
	* look out for namespace nodes in the node-set.
	*/
	if (obj->nodesetval != NULL) {
	    if (obj->nodesetval->nodeTab != NULL)
		xmlFree(obj->nodesetval->nodeTab);
	    xmlFree(obj->nodesetval);
	}
	xmlFree(obj);
#ifdef XP_DEBUG_OBJ_USAGE
	xmlXPathDebugObjCounterAll--;
#endif
    }
    xmlPointerListFree(list);
}